

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

llm_graph_input_attn_cross * __thiscall
llm_graph_context::build_attn_inp_cross(llm_graph_context *this)

{
  llama_cross *plVar1;
  uint32_t uVar2;
  _func_int **pp_Var3;
  llm_graph_input_attn_cross *plVar4;
  pointer __p;
  pointer *__ptr;
  _Head_base<0UL,_llm_graph_input_i_*,_false> local_18;
  __uniq_ptr_impl<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> local_10;
  
  std::make_unique<llm_graph_input_attn_cross,llama_cross_const*const&>((llama_cross **)&local_18);
  plVar1 = this->cross;
  if ((plVar1->v_embd).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (plVar1->v_embd).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar2 = this->hparams->n_ctx_train;
  }
  else {
    uVar2 = (uint32_t)plVar1->n_enc;
  }
  pp_Var3 = (_func_int **)
            ggml_new_tensor_2d(this->ctx0,0,(long)(int)uVar2,
                               (long)this->n_tokens + 0x3fU & 0xffffffffffffffc0);
  local_18._M_head_impl[1]._vptr_llm_graph_input_i = pp_Var3;
  ggml_set_input(pp_Var3);
  if (this->cparams->flash_attn == true) {
    pp_Var3 = (_func_int **)ggml_cast(this->ctx0,local_18._M_head_impl[1]._vptr_llm_graph_input_i,1)
    ;
    local_10._M_t.
    super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
    super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
         (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
         (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)local_18._M_head_impl;
  }
  else {
    pp_Var3 = local_18._M_head_impl[1]._vptr_llm_graph_input_i;
    local_10._M_t.
    super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
    super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
         (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
         (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)local_18._M_head_impl;
  }
  ((llm_graph_input_i *)
  ((long)local_10._M_t.
         super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
         super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x10))->
  _vptr_llm_graph_input_i = pp_Var3;
  local_18._M_head_impl = (llm_graph_input_i *)0x0;
  plVar4 = (llm_graph_input_attn_cross *)
           llm_graph_result::add_input
                     ((this->res)._M_t.
                      super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>
                      .super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl,
                      (llm_graph_input_ptr *)&local_10);
  if ((_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
      local_10._M_t.
      super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
      super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl != (llm_graph_input_i *)0x0) {
    (*(*(_func_int ***)
        local_10._M_t.
        super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
        super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl)[1])();
  }
  local_10._M_t.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       (_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)0x0;
  if (local_18._M_head_impl != (llm_graph_input_i *)0x0) {
    (*(local_18._M_head_impl)->_vptr_llm_graph_input_i[1])();
  }
  return plVar4;
}

Assistant:

llm_graph_input_attn_cross * llm_graph_context::build_attn_inp_cross() const {
    auto inp = std::make_unique<llm_graph_input_attn_cross>(cross);

    const int32_t n_enc = !cross->v_embd.empty() ? cross->n_enc : hparams.n_ctx_train;

    inp->cross_kq_mask = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_enc, GGML_PAD(n_tokens, GGML_KQ_MASK_PAD));
    ggml_set_input(inp->cross_kq_mask);

    inp->cross_kq_mask_cnv = cparams.flash_attn ? ggml_cast(ctx0, inp->cross_kq_mask, GGML_TYPE_F16) : inp->cross_kq_mask;

    return (llm_graph_input_attn_cross *) res->add_input(std::move(inp));
}